

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void SetAccessorRange<float>
               (Ref<glTF2::Accessor> acc,void *data,size_t count,uint numCompsIn,uint numCompsOut)

{
  void *pvVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar6;
  uint uVar7;
  double dVar8;
  double local_40;
  size_t local_38;
  
  pvVar6 = acc.vector;
  local_38 = count;
  if (numCompsOut <= numCompsIn) {
    uVar4 = acc._8_8_ & 0xffffffff;
    if (numCompsOut != 0) {
      uVar7 = numCompsOut;
      do {
        local_40 = 1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar6->
                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar4]->min,&local_40);
        local_40 = -1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar6->
                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar4]->max,&local_40);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    lVar3 = local_38 * numCompsIn;
    if (0 < lVar3) {
      pvVar1 = (void *)((long)data + lVar3 * 4);
      do {
        if (numCompsOut != 0) {
          uVar5 = 0;
          do {
            dVar8 = (double)*(float *)((long)data + uVar5 * 4);
            lVar3 = *(long *)&((pvVar6->
                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar4]->min).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            if (dVar8 < *(double *)(lVar3 + uVar5 * 8)) {
              *(double *)(lVar3 + uVar5 * 8) = dVar8;
            }
            lVar3 = *(long *)&((pvVar6->
                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar4]->max).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            pdVar2 = (double *)(lVar3 + uVar5 * 8);
            if (*pdVar2 <= dVar8 && dVar8 != *pdVar2) {
              *(double *)(lVar3 + uVar5 * 8) = dVar8;
            }
            uVar5 = uVar5 + 1;
          } while (numCompsOut != uVar5);
        }
        data = (void *)((long)data + (ulong)numCompsIn * 4);
      } while (data < pvVar1);
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Exporter.cpp"
                ,0xa1,
                "void SetAccessorRange(Ref<Accessor>, void *, size_t, unsigned int, unsigned int) [T = float]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, size_t count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}